

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O2

ZoneTreeNode *
asmjit::v1_14::ZoneTree<asmjit::v1_14::ConstPool::Node>::_singleRotate
          (ZoneTreeNode *root,size_t dir)

{
  ZoneTreeNode *pZVar1;
  
  pZVar1 = (ZoneTreeNode *)(*(ulong *)(root + (ulong)(dir == 0) * 8) & 0xfffffffffffffffe);
  *(ulong *)(root + (ulong)(dir == 0) * 8) =
       (ulong)((uint)*(ulong *)(root + (ulong)(dir == 0) * 8) & 1) |
       *(ulong *)(pZVar1 + dir * 8) & 0xfffffffffffffffe;
  *(ulong *)(pZVar1 + dir * 8) = (ulong)((uint)*(undefined8 *)(pZVar1 + dir * 8) & 1) | (ulong)root;
  *root = (ZoneTreeNode)((byte)*root | 1);
  *pZVar1 = (ZoneTreeNode)((byte)*pZVar1 & 0xfe);
  return pZVar1;
}

Assistant:

static inline ZoneTreeNode* _singleRotate(ZoneTreeNode* ASMJIT_NONNULL(root), size_t dir) noexcept {
    ZoneTreeNode* save = root->_getChild(!dir);
    ASMJIT_ASSUME(save != nullptr);

    ZoneTreeNode* saveChild = save->_getChild(dir);
    root->_setChild(!dir, saveChild);
    save->_setChild( dir, root);
    root->_makeRed();
    save->_makeBlack();
    return save;
  }